

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O3

void __thiscall
NetworkNS::cb3D_integrator::cb3D_integrator
          (cb3D_integrator *this,NetwMin *init_net,double temperature,double slipspring_rate)

{
  uint uVar1;
  size_t __size;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  double **ppdVar8;
  ostream *poVar9;
  Network *pNVar10;
  Hopping *this_00;
  _List_node_base *p_Var11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  size_t __size_00;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  this->cur_bd_net = init_net;
  this->bd_cur_step = 0;
  uVar12 = (init_net->network->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl.
           _M_node._M_size;
  uVar13 = (uint)uVar12;
  this->dofs = uVar13;
  this->dofs_3N = uVar13 * 3;
  __size = (uVar12 & 0xffffffff) * 8;
  pdVar6 = (double *)malloc(__size);
  this->xshift = pdVar6;
  pdVar6 = (double *)malloc(__size);
  this->yshift = pdVar6;
  pdVar6 = (double *)malloc(__size);
  this->zshift = pdVar6;
  piVar7 = (int *)malloc((uVar12 & 0xffffffff) << 2);
  this->grid_cell = piVar7;
  __size_00 = (ulong)(uVar13 * 3) << 3;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_x = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_x_ps = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_mass = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_f = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_f_ps = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_nb_f = pdVar6;
  pdVar6 = (double *)malloc(__size_00);
  this->bd_gamma = pdVar6;
  ppdVar8 = (double **)malloc(__size);
  this->bd_stress = ppdVar8;
  if (uVar13 != 0) {
    uVar15 = 0;
    do {
      pdVar6 = (double *)malloc(0x30);
      this->bd_stress[uVar15] = pdVar6;
      uVar15 = uVar15 + 1;
    } while ((uVar12 & 0xffffffff) != uVar15);
  }
  this->bd_temp = temperature;
  dVar16 = pow(10.0,607.5 / (temperature + -211.15 + 45.0) + -10.4);
  pNVar10 = this->cur_bd_net->network;
  p_Var11 = (pNVar10->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
            super__List_node_base._M_next;
  pdVar6 = this->bd_gamma;
  pdVar3 = this->bd_mass;
  if (p_Var11 != (_List_node_base *)&pNVar10->nodes) {
    dVar17 = (dVar16 * 0.001) / 1.1311591129852e-25;
    pdVar4 = this->bd_x;
    pdVar5 = this->bd_x_ps;
    uVar13 = 2;
    do {
      uVar14 = uVar13 - 2;
      pdVar4[uVar14] = (double)*(_List_node_base **)((long)(p_Var11 + 1) + 8);
      uVar1 = uVar13 - 1;
      pdVar4[uVar1] = (double)p_Var11[2]._M_next;
      pdVar4[uVar13] = (double)*(_List_node_base **)((long)(p_Var11 + 2) + 8);
      pdVar5[uVar14] = (double)*(_List_node_base **)((long)(p_Var11 + 1) + 8);
      pdVar5[uVar1] = (double)p_Var11[2]._M_next;
      pdVar5[uVar13] = (double)*(_List_node_base **)((long)(p_Var11 + 2) + 8);
      dVar2 = (double)p_Var11[10]._M_next;
      pdVar3[uVar14] = dVar2;
      pdVar3[uVar1] = dVar2;
      pdVar3[uVar13] = (double)p_Var11[10]._M_next;
      pdVar6[uVar14] = dVar17;
      pdVar6[uVar1] = dVar17;
      pdVar6[uVar13] = dVar17;
      p_Var11 = p_Var11->_M_next;
      uVar13 = uVar13 + 3;
    } while (p_Var11 != (_List_node_base *)&pNVar10->nodes);
  }
  dVar17 = *pdVar3;
  dVar2 = *pdVar6;
  this->gamma_mass_opt = true;
  if (1 < (ulong)this->dofs_3N) {
    uVar12 = 1;
    dVar17 = dVar17 * dVar2;
    do {
      pdVar4 = pdVar6 + uVar12;
      pdVar5 = pdVar3 + uVar12;
      dVar17 = *pdVar4 * *pdVar5 - dVar17;
      if (0.0001 <= dVar17 * dVar17) {
        this->gamma_mass_opt = false;
        goto LAB_00104263;
      }
      uVar12 = uVar12 + 1;
      dVar17 = *pdVar4 * *pdVar5;
    } while (this->dofs_3N != uVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- All beads have the same mass and friction coefficient.\n"
             ,0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- The monomeric friction coefficient is ",0x2d);
  poVar9 = std::ostream::_M_insert<double>(dVar16 * 0.001);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," kg/s.\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#: --- The friction coefficient is ",0x23);
  poVar9 = std::ostream::_M_insert<double>(*this->bd_gamma);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," s^{-1}.\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#: --- The bead friction coefficient is ",0x28);
  poVar9 = std::ostream::_M_insert<double>(*this->bd_mass * *this->bd_gamma * 1.660538921e-27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," kg/s.\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"#: --- The expected Rouse diffusivity multiplied by N would be: ",0x40);
  poVar9 = std::ostream::_M_insert<double>
                     ((((this->bd_temp * 1.3806488e-23) / *this->bd_mass) / *this->bd_gamma) /
                      1.660538921e-27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," m^2/s.\n#:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pNVar10 = this->cur_bd_net->network;
LAB_00104263:
  if ((pNVar10->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
      _M_node._M_size != 0) {
    this_00 = (Hopping *)operator_new(0x408);
    Hopping::Hopping(this_00,slipspring_rate);
    this->my_hopping_scheme = this_00;
  }
  return;
}

Assistant:

cb3D_integrator::cb3D_integrator(class NetwMin *init_net, double temperature, double slipspring_rate) {
      
      
      cur_bd_net = init_net;
      bd_cur_step = 0;
      dofs = cur_bd_net->network->nodes.size();
      dofs_3N = 3 * dofs;
      
      xshift = (double*)malloc(dofs*sizeof(double));
      yshift = (double*)malloc(dofs*sizeof(double));
      zshift = (double*)malloc(dofs*sizeof(double));
      grid_cell = (int*)malloc(dofs*sizeof(int));

      bd_x = (double*) malloc(dofs_3N * sizeof (double));
      bd_x_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_mass = (double*) malloc(dofs_3N * sizeof (double));
      bd_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_f_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_nb_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_gamma = (double*) malloc(dofs_3N * sizeof (double));
      
      
      bd_stress = (double**)malloc(dofs * sizeof(double*));
      for(unsigned int i = 0; i < dofs; i++)
         bd_stress[i] = (double*)malloc(6*sizeof(double));
      
      
      // Set the temperature:
      bd_temp = temperature;

      double gamma;
      unsigned int inode = 0;


      /** Klopffer et al. (\a Polymer \b 1998, \a 39, 3445 - 3449) have characterized the 
       *  rheological behavior of a series of polybutadienes and polyisoprenes over a wide
       *  range of temperatures. The viscoelastic coefficients resulting from the time-
       *  temperature superposition principle were determined. The Rouse theory modified for 
       *  undiluted polymers was used to calculate the monomeric friction coefficient, 
       *  @f$ \zeta_0@f$ from the transition zone.
       *  It was concluded that, within experimental error, a single set of WLF parameters at
       *  @f$ T_{\rm g}@f$ was adequate to characterize the relaxation dynamics irrespective of
       *  the vinyl content of the polybutadienes and polyisoprenes. 
       */

      /** The monomeric friction coefficient, @f$\zeta_0 @f$, characterizes the resistance 
       * encountered by a monomer unit moving through its surroundings. It has been shown to follow 
       * the WLF law. The variation of the monomeric friction coefficient with temperature is: 
       * @f[ \log{\zeta_0 \left(T\right)} = \log{\zeta_\infty} + \frac{C_1^{\rm g}C_2^{\rm g}}
       *    {T-T_{\rm g} + C_2^{\rm g}} @f]
       * with the parameters @f$ C_1^{\rm g} = 13.5 \pm 0.2 @f$, 
       * @f$ C_2^{\rm g} = 45 \pm 3 \;{\rm K}@f$, 
       * @f$ \log{\zeta_\infty} = -10.4 \;{\rm dyn\;s\;cm}^{-1}@f$ 
       * and @f$ T_{\rm g} = 211.15 \;{\rm K} @f$. 
       * At a temperature of 298 K, 
       * @f$\zeta_0(298\:{\rm K}) = 1.61 \times 10^{-6} \;{\rm dyn\;s\;cm}^{-1}@f$, while
       * at a temperature of  500 K,
       * @f$\zeta_0(500\:{\rm K}) = 2.63 \times 10^{-9} \;{\rm dyn\;s\;cm}^{-1}
       * = 2.63 \times 10^{-12} \;{\rm kg/s}@f$.
       */

      // Monomeric friction coefficient in  kg/s
      double monomeric_friction = 1.e-3 * pow(10.0, ((13.5 * 45.0)/(bd_temp-211.15+45)-10.4)); 
      
      /** The @f$\zeta @f$ parameter refers to a monomer of PI moving through its environment. 
       *  Since, we are dealing with larger entities, we analyze it as:
       * @f[ \zeta_0 \left(T\right) = \gamma\left(T\right) \cdot m_{\rm monomer} @f]
       * where @f$ \gamma (T)@f$ is measured in @f$ {\rm s}^{-1} @f$ and can be then multiplied by 
       * the mass of the Brownian bead which consists of several PI monomers.
       */

      // convert monomeric friction coefficient (kg/s) to g/mol/s and then divide it with the mass 
      // of a PI monomer 
      gamma = monomeric_friction / (pi_monomer_mass * amu_to_kg); // s^{-1}

      for (std::list<tNode>::iterator it = cur_bd_net->network->nodes.begin();
              it != cur_bd_net->network->nodes.end(); ++it) {

         // positions in A
         bd_x[3 * inode + 0] = (*it).Pos[0];
         bd_x[3 * inode + 1] = (*it).Pos[1];
         bd_x[3 * inode + 2] = (*it).Pos[2];

         // positions in A
         bd_x_ps[3 * inode + 0] = (*it).Pos[0];
         bd_x_ps[3 * inode + 1] = (*it).Pos[1];
         bd_x_ps[3 * inode + 2] = (*it).Pos[2];

         // mass of nodal points in g/mol
         bd_mass[3 * inode + 0] = (*it).mass;
         bd_mass[3 * inode + 1] = (*it).mass;
         bd_mass[3 * inode + 2] = (*it).mass;

         // All gamma are measured in s^{-1}
         bd_gamma[3 * inode + 0] = gamma;
         bd_gamma[3 * inode + 1] = gamma;
         bd_gamma[3 * inode + 2] = gamma;

         inode++;
      }

      
      /* Check whether all beads have the same mass and the same friction coefficient. */
      double prev_val = bd_mass[0] * bd_gamma[0];
      gamma_mass_opt = true;
      for (inode = 1; inode < dofs_3N; inode++){
         if ( ((bd_mass[inode]*bd_gamma[inode])-prev_val)
             *((bd_mass[inode]*bd_gamma[inode])-prev_val) >= tol){
            gamma_mass_opt = false;
            break;
         }
         else
            prev_val = bd_mass[inode]*bd_gamma[inode];
      }
      
      if (gamma_mass_opt) 
         cout << "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n"
              << "#: --- All beads have the same mass and friction coefficient.\n" 
              << "#: --- The monomeric friction coefficient is " << monomeric_friction << " kg/s.\n"
              << "#: --- The friction coefficient is " << bd_gamma[0] << " s^{-1}.\n" 
              << "#: --- The bead friction coefficient is " << bd_mass[0]*bd_gamma[0]*amu_to_kg 
              << " kg/s.\n" 
              << "#: --- The expected Rouse diffusivity multiplied by N would be: " 
              << boltz_const_Joule_K * bd_temp / bd_mass[0] / bd_gamma[0] / amu_to_kg 
              << " m^2/s.\n#:"<< endl;
      
      // Initialize the coupled hopping scheme:
      // Here we can input the zeta parameter...
      if (cur_bd_net->network->pslip_springs.size() > 0)
         my_hopping_scheme = new Hopping(slipspring_rate);
            
      return;
   }